

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

void Abc_NtkDressPrintStats(Vec_Ptr_t *vRes,int nNodes0,int nNodes1,abctime Time)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  
  lVar2 = (long)vRes->nSize;
  if (lVar2 < 1) {
    iVar5 = 0;
    iVar14 = 0;
    iVar1 = 0;
    iVar3 = 0;
    uVar16 = 0;
    uVar7 = 0;
  }
  else {
    lVar9 = 0;
    uVar7 = 0;
    uVar16 = 0;
    iVar3 = 0;
    iVar1 = 0;
    iVar14 = 0;
    iVar5 = 0;
    do {
      lVar17 = (long)*(int *)((long)vRes->pArray[lVar9] + 4);
      iVar11 = 0;
      iVar12 = 0;
      iVar10 = 0;
      iVar13 = 0;
      if (0 < lVar17) {
        lVar4 = 0;
        iVar13 = 0;
        iVar10 = 0;
        iVar12 = 0;
        iVar11 = 0;
        do {
          uVar6 = *(uint *)(*(long *)((long)vRes->pArray[lVar9] + 8) + lVar4 * 4);
          if ((uVar6 & 1) == 0) {
            if ((uVar6 & 2) == 0) {
              iVar12 = iVar12 + 1;
            }
            else {
              iVar13 = iVar13 + 1;
            }
          }
          else if ((uVar6 & 2) == 0) {
            iVar11 = iVar11 + 1;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar17 != lVar4);
      }
      iVar1 = iVar1 + iVar12;
      iVar3 = iVar3 + iVar11;
      iVar5 = iVar5 + iVar13;
      iVar14 = iVar14 + iVar10;
      iVar8 = iVar10 + iVar11;
      if (iVar13 + iVar12 < iVar10 + iVar11) {
        iVar8 = iVar13 + iVar12;
      }
      uVar16 = uVar16 + iVar8;
      if (iVar13 < iVar10) {
        iVar10 = iVar13;
      }
      if (iVar12 < iVar11) {
        iVar11 = iVar12;
      }
      uVar7 = uVar7 + iVar11 + iVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar2);
  }
  uVar15 = iVar14 + iVar3;
  uVar6 = iVar5 + iVar1;
  printf("Total number of equiv classes                = %7d.\n",lVar2);
  printf("Participating nodes from both networks       = %7d.\n",(ulong)(uVar6 + uVar15));
  dVar18 = (double)(nNodes0 + 1);
  printf("Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n",
         ((double)(int)uVar6 * 100.0) / dVar18,(ulong)uVar6);
  printf("Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n",
         ((double)(int)uVar15 * 100.0) / (double)(nNodes1 + 1),(ulong)uVar15);
  printf("Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n",
         ((double)(int)uVar16 * 100.0) / dVar18,(ulong)uVar16);
  iVar1 = 0x95736b;
  printf("Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n",
         ((double)(int)uVar7 * 100.0) / dVar18,(ulong)uVar7);
  Abc_Print(iVar1,"%s =","Total runtime");
  Abc_Print(iVar1,"%9.2f sec\n",(double)Time / 1000000.0);
  return;
}

Assistant:

void Abc_NtkDressPrintStats( Vec_Ptr_t * vRes, int nNodes0, int nNodes1, abctime Time )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    int NegAll[2] = {0}, PosAll[2] = {0}, PairsAll = 0, PairsOne = 0;
    int Pos[2], Neg[2];
    // count the number of equivalences in each class
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        Pos[0] = Pos[1] = 0;
        Neg[0] = Neg[1] = 0;
        Vec_IntForEachEntry( vClass, Entry, k )
        {
            if ( Abc_ObjEquivId2NtkId(Entry) )
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[1]++; // negative polarity in network 1
                else
                    Pos[1]++; // positive polarity in network 1
            }
            else
            {
                if ( Abc_ObjEquivId2Polar(Entry) )
                    Neg[0]++; // negative polarity in network 0
                else
                    Pos[0]++; // positive polarity in network 0
            }
        }
        PosAll[0] += Pos[0]; // total positive polarity in network 0
        PosAll[1] += Pos[1]; // total positive polarity in network 1
        NegAll[0] += Neg[0]; // total negative polarity in network 0
        NegAll[1] += Neg[1]; // total negative polarity in network 1

        // assuming that the name can be transferred to only one node
        PairsAll += Abc_MinInt(Neg[0] + Pos[0], Neg[1] + Pos[1]);
        PairsOne += Abc_MinInt(Neg[0], Neg[1]) + Abc_MinInt(Pos[0], Pos[1]);
    }
    printf( "Total number of equiv classes                = %7d.\n", Vec_PtrSize(vRes) );
    printf( "Participating nodes from both networks       = %7d.\n", NegAll[0]+PosAll[0]+NegAll[1]+PosAll[1] );
    printf( "Participating nodes from the first network   = %7d. (%7.2f %% of nodes)\n", NegAll[0]+PosAll[0], 100.0*(NegAll[0]+PosAll[0])/(nNodes0+1) );
    printf( "Participating nodes from the second network  = %7d. (%7.2f %% of nodes)\n", NegAll[1]+PosAll[1], 100.0*(NegAll[1]+PosAll[1])/(nNodes1+1) );
    printf( "Node pairs (any polarity)                    = %7d. (%7.2f %% of names can be moved)\n", PairsAll, 100.0*PairsAll/(nNodes0+1) );
    printf( "Node pairs (same polarity)                   = %7d. (%7.2f %% of names can be moved)\n", PairsOne, 100.0*PairsOne/(nNodes0+1) );
    ABC_PRT( "Total runtime", Time );
}